

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::setBitsSlowCase(APInt *this,uint loBit,uint hiBit)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = (ulong)(loBit >> 6);
  uVar2 = -1L << ((byte)loBit & 0x3f);
  uVar4 = hiBit >> 6;
  if ((hiBit & 0x3f) != 0) {
    uVar3 = 0xffffffffffffffff >> (-(char)(hiBit & 0x3f) & 0x3fU);
    if (uVar4 == loBit >> 6) {
      uVar2 = uVar2 & uVar3;
    }
    else {
      (this->U).pVal[uVar4] = (this->U).pVal[uVar4] | uVar3;
    }
  }
  (this->U).pVal[uVar1] = (this->U).pVal[uVar1] | uVar2;
  while (uVar1 = uVar1 + 1, uVar1 < uVar4) {
    (this->U).pVal[uVar1] = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void APInt::setBitsSlowCase(unsigned loBit, unsigned hiBit) {
  unsigned loWord = whichWord(loBit);
  unsigned hiWord = whichWord(hiBit);

  // Create an initial mask for the low word with zeros below loBit.
  uint64_t loMask = WORD_MAX << whichBit(loBit);

  // If hiBit is not aligned, we need a high mask.
  unsigned hiShiftAmt = whichBit(hiBit);
  if (hiShiftAmt != 0) {
    // Create a high mask with zeros above hiBit.
    uint64_t hiMask = WORD_MAX >> (APINT_BITS_PER_WORD - hiShiftAmt);
    // If loWord and hiWord are equal, then we combine the masks. Otherwise,
    // set the bits in hiWord.
    if (hiWord == loWord)
      loMask &= hiMask;
    else
      U.pVal[hiWord] |= hiMask;
  }
  // Apply the mask to the low word.
  U.pVal[loWord] |= loMask;

  // Fill any words between loWord and hiWord with all ones.
  for (unsigned word = loWord + 1; word < hiWord; ++word)
    U.pVal[word] = WORD_MAX;
}